

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pager_write(PgHdr *pPg)

{
  u8 uVar1;
  Pgno PVar2;
  u32 i;
  Pager *pPager;
  sqlite3_vfs *pVfs;
  sqlite3_file *psVar3;
  int nSpill;
  int iVar4;
  MemJournal *p;
  Bitvec *__s;
  bool bVar5;
  
  pPager = pPg->pPager;
  if (pPager->eState != '\x02') goto LAB_00138c03;
  iVar4 = pPager->errCode;
  if (iVar4 == 0) {
    iVar4 = 0;
    if ((pPager->pWal == (Wal *)0x0) && (pPager->journalMode != '\x02')) {
      pVfs = pPager->pVfs;
      PVar2 = pPager->dbSize;
      __s = (Bitvec *)sqlite3Malloc(0x200);
      if (__s == (Bitvec *)0x0) {
        pPager->pInJournal = (Bitvec *)0x0;
        iVar4 = 7;
        goto LAB_00138bff;
      }
      iVar4 = 0;
      memset(__s,0,0x200);
      __s->iSize = PVar2;
      pPager->pInJournal = __s;
      nSpill = sqlite3Config.nStmtSpill;
      psVar3 = pPager->jfd;
      if (psVar3->pMethods == (sqlite3_io_methods *)0x0) {
        if (pPager->journalMode == '\x04') {
          psVar3->pMethods = (sqlite3_io_methods *)0x0;
          psVar3[1].pMethods = (sqlite3_io_methods *)0x0;
          psVar3[8].pMethods = (sqlite3_io_methods *)0x0;
          psVar3[9].pMethods = (sqlite3_io_methods *)0x0;
          psVar3[6].pMethods = (sqlite3_io_methods *)0x0;
          psVar3[7].pMethods = (sqlite3_io_methods *)0x0;
          psVar3[4].pMethods = (sqlite3_io_methods *)0x0;
          psVar3[5].pMethods = (sqlite3_io_methods *)0x0;
          psVar3[2].pMethods = (sqlite3_io_methods *)0x0;
          psVar3[3].pMethods = (sqlite3_io_methods *)0x0;
          psVar3[10].pMethods = (sqlite3_io_methods *)0x0;
          psVar3[1].pMethods = (sqlite3_io_methods *)0xffffffff000003f8;
          psVar3->pMethods = &MemJournalMethods;
          *(undefined4 *)&psVar3[8].pMethods = 0;
          psVar3[9].pMethods = (sqlite3_io_methods *)0x0;
          psVar3[10].pMethods = (sqlite3_io_methods *)0x0;
        }
        else {
          uVar1 = pPager->tempFile;
          iVar4 = databaseIsUnmoved(pPager);
          if (iVar4 == 0) {
            bVar5 = uVar1 == '\0';
            if (bVar5) {
              nSpill = 0;
            }
            iVar4 = 0x100e;
            if (bVar5) {
              iVar4 = 0x806;
            }
            iVar4 = sqlite3JournalOpen(pVfs,pPager->zJournal,pPager->jfd,iVar4,nSpill);
          }
        }
      }
      if (iVar4 == 0) {
        pPager->nRec = 0;
        pPager->setMaster = '\0';
        pPager->journalOff = 0;
        pPager->journalHdr = 0;
        iVar4 = writeJournalHdr(pPager);
      }
    }
    if (iVar4 == 0) {
      pPager->eState = '\x03';
    }
    else {
      sqlite3BitvecDestroy(pPager->pInJournal);
      pPager->pInJournal = (Bitvec *)0x0;
    }
  }
LAB_00138bff:
  if (iVar4 != 0) {
    return iVar4;
  }
LAB_00138c03:
  sqlite3PcacheMakeDirty(pPg);
  if (pPager->pInJournal != (Bitvec *)0x0) {
    i = pPg->pgno;
    iVar4 = sqlite3BitvecTestNotNull(pPager->pInJournal,i);
    if (iVar4 == 0) {
      if (pPager->dbOrigSize < i) {
        if (pPager->eState != '\x04') {
          *(byte *)&pPg->flags = (byte)pPg->flags | 8;
        }
      }
      else {
        iVar4 = pagerAddPageToRollbackJournal(pPg);
        if (iVar4 != 0) {
          return iVar4;
        }
      }
    }
  }
  *(byte *)&pPg->flags = (byte)pPg->flags | 4;
  if (pPager->nSavepoint < 1) {
    iVar4 = 0;
  }
  else {
    iVar4 = subjournalPageIfRequired(pPg);
  }
  if (pPager->dbSize < pPg->pgno) {
    pPager->dbSize = pPg->pgno;
  }
  return iVar4;
}

Assistant:

static int pager_write(PgHdr *pPg){
  Pager *pPager = pPg->pPager;
  int rc = SQLITE_OK;

  /* This routine is not called unless a write-transaction has already 
  ** been started. The journal file may or may not be open at this point.
  ** It is never called in the ERROR state.
  */
  assert( pPager->eState==PAGER_WRITER_LOCKED
       || pPager->eState==PAGER_WRITER_CACHEMOD
       || pPager->eState==PAGER_WRITER_DBMOD
  );
  assert( assert_pager_state(pPager) );
  assert( pPager->errCode==0 );
  assert( pPager->readOnly==0 );
  CHECK_PAGE(pPg);

  /* The journal file needs to be opened. Higher level routines have already
  ** obtained the necessary locks to begin the write-transaction, but the
  ** rollback journal might not yet be open. Open it now if this is the case.
  **
  ** This is done before calling sqlite3PcacheMakeDirty() on the page. 
  ** Otherwise, if it were done after calling sqlite3PcacheMakeDirty(), then
  ** an error might occur and the pager would end up in WRITER_LOCKED state
  ** with pages marked as dirty in the cache.
  */
  if( pPager->eState==PAGER_WRITER_LOCKED ){
    rc = pager_open_journal(pPager);
    if( rc!=SQLITE_OK ) return rc;
  }
  assert( pPager->eState>=PAGER_WRITER_CACHEMOD );
  assert( assert_pager_state(pPager) );

  /* Mark the page that is about to be modified as dirty. */
  sqlite3PcacheMakeDirty(pPg);

  /* If a rollback journal is in use, them make sure the page that is about
  ** to change is in the rollback journal, or if the page is a new page off
  ** then end of the file, make sure it is marked as PGHDR_NEED_SYNC.
  */
  assert( (pPager->pInJournal!=0) == isOpen(pPager->jfd) );
  if( pPager->pInJournal!=0
   && sqlite3BitvecTestNotNull(pPager->pInJournal, pPg->pgno)==0
  ){
    assert( pagerUseWal(pPager)==0 );
    if( pPg->pgno<=pPager->dbOrigSize ){
      rc = pagerAddPageToRollbackJournal(pPg);
      if( rc!=SQLITE_OK ){
        return rc;
      }
    }else{
      if( pPager->eState!=PAGER_WRITER_DBMOD ){
        pPg->flags |= PGHDR_NEED_SYNC;
      }
      PAGERTRACE(("APPEND %d page %d needSync=%d\n",
              PAGERID(pPager), pPg->pgno,
             ((pPg->flags&PGHDR_NEED_SYNC)?1:0)));
    }
  }

  /* The PGHDR_DIRTY bit is set above when the page was added to the dirty-list
  ** and before writing the page into the rollback journal.  Wait until now,
  ** after the page has been successfully journalled, before setting the
  ** PGHDR_WRITEABLE bit that indicates that the page can be safely modified.
  */
  pPg->flags |= PGHDR_WRITEABLE;
  
  /* If the statement journal is open and the page is not in it,
  ** then write the page into the statement journal.
  */
  if( pPager->nSavepoint>0 ){
    rc = subjournalPageIfRequired(pPg);
  }

  /* Update the database size and return. */
  if( pPager->dbSize<pPg->pgno ){
    pPager->dbSize = pPg->pgno;
  }
  return rc;
}